

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall
SAT::explainUnlearnable(SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *param_2)

{
  Lit p_00;
  bool bVar1;
  uint uVar2;
  Lit *pLVar3;
  LitFlags *this_00;
  Clause *this_01;
  Lit *pLVar4;
  char *pcVar5;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> this_02;
  long in_RDI;
  uint i_1;
  Lit q;
  uint j;
  Clause *c;
  Lit p;
  uint i;
  vec<Lit> removed;
  time_point start;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffe90;
  SAT *in_stack_fffffffffffffe98;
  vec<Lit> *in_stack_fffffffffffffea0;
  SAT *in_stack_fffffffffffffed0;
  Lit in_stack_fffffffffffffedc;
  uint local_74;
  uint local_5c;
  uint local_2c;
  vec<Lit> local_28;
  undefined8 local_18;
  
  local_18 = std::chrono::_V2::steady_clock::now();
  vec<Lit>::vec(&local_28);
  for (local_2c = 1; uVar2 = vec<Lit>::size((vec<Lit> *)(in_RDI + 0x100)), local_2c < uVar2;
      local_2c = local_2c + 1) {
    pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_2c);
    uVar2 = ::var((Lit)pLVar3->x);
    this_00 = vec<LitFlags>::operator[]((vec<LitFlags> *)(in_RDI + 0x80),uVar2);
    bVar1 = LitFlags::learnable(this_00);
    if (!bVar1) {
      operator~((Lit)0x299530);
      this_01 = getExpl(in_stack_fffffffffffffed0,in_stack_fffffffffffffedc);
      vec<Lit>::push(in_stack_fffffffffffffea0,(Lit *)in_stack_fffffffffffffe98);
      pLVar3 = vec<Lit>::last((vec<Lit> *)(in_RDI + 0x100));
      pLVar4 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_2c);
      pLVar4->x = pLVar3->x;
      vec<Lit>::pop((vec<Lit> *)(in_RDI + 0x100));
      vec<int>::pop((vec<int> *)(in_RDI + 0x110));
      local_2c = local_2c - 1;
      for (local_5c = 1; uVar2 = Clause::size(this_01), local_5c < uVar2; local_5c = local_5c + 1) {
        pLVar3 = Clause::operator[]((Clause *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        p_00.x = pLVar3->x;
        uVar2 = ::var(p_00);
        pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x120),uVar2);
        if (*pcVar5 == '\0') {
          uVar2 = ::var(p_00);
          pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x120),uVar2);
          *pcVar5 = '\x01';
          vec<Lit>::push(in_stack_fffffffffffffea0,(Lit *)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffed0 = (SAT *)(in_RDI + 0x110);
          in_stack_fffffffffffffedc.x = ::var(p_00);
          getLevel(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
          vec<int>::push((vec<int> *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98);
        }
      }
    }
  }
  for (local_74 = 0; uVar2 = vec<Lit>::size(&local_28), local_74 < uVar2; local_74 = local_74 + 1) {
    pLVar3 = vec<Lit>::operator[](&local_28,local_74);
    uVar2 = ::var((Lit)pLVar3->x);
    pcVar5 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x120),uVar2);
    *pcVar5 = '\0';
  }
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  this_02 = std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
            ((duration<long,_std::ratio<1L,_1000L>_> *)this_02.__r,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  vec<Lit>::~vec((vec<Lit> *)this_02.__r);
  return;
}

Assistant:

void SAT::explainUnlearnable(std::set<int>& /*contributingNogoods*/) {
	const time_point start = chuffed_clock::now();

	vec<Lit> removed;
	for (unsigned int i = 1; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		if (flags[var(p)].learnable()) {
			continue;
		}
		assert(!reason[var(p)].isLazy());
		Clause& c = *getExpl(~p);
		removed.push(p);
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			}
		}
	}

	for (unsigned int i = 0; i < removed.size(); i++) {
		seen[var(removed[i])] = 0;
	}

	pushback_time += std::chrono::duration_cast<duration>(chuffed_clock::now() - start);
}